

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regparse.c
# Opt level: O2

int prs_branch(Node **top,PToken *tok,int term,OnigUChar **src,OnigUChar *end,ParseEnv *env,
              int group_head)

{
  _Node *p_Var1;
  uint uVar2;
  int iVar3;
  Node *pNVar4;
  Node *pNVar5;
  Node *node;
  Node *local_50;
  OnigUChar **local_48;
  OnigUChar *local_40;
  PToken *local_38;
  
  *top = (Node *)0x0;
  uVar2 = env->parse_depth + 1;
  env->parse_depth = uVar2;
  if (ParseDepthLimit < uVar2) {
    iVar3 = -0x10;
  }
  else {
    local_38 = tok;
    iVar3 = prs_exp(&local_50,tok,term,src,end,env,group_head);
    node = local_50;
    if (iVar3 < 0) {
LAB_001134ab:
      onig_node_free(local_50);
    }
    else if ((iVar3 == 0) || (iVar3 == term || iVar3 == 0xd)) {
      *top = local_50;
LAB_0011349e:
      env->parse_depth = env->parse_depth - 1;
    }
    else {
      local_48 = src;
      local_40 = end;
      pNVar4 = node_new_list(local_50,(Node *)0x0);
      *top = pNVar4;
      if (pNVar4 != (Node *)0x0) {
        do {
          while( true ) {
            if (iVar3 == 0) {
              iVar3 = 0;
              goto LAB_0011349e;
            }
            if ((iVar3 == term) || (iVar3 == 0xd)) goto LAB_0011349e;
            iVar3 = prs_exp(&local_50,local_38,term,local_48,local_40,env,0);
            node = local_50;
            if (iVar3 < 0) goto LAB_001134ab;
            if ((local_50->u).base.node_type != ND_LIST) break;
            (pNVar4->u).cons.cdr = local_50;
            p_Var1 = local_50;
            do {
              pNVar4 = p_Var1;
              p_Var1 = (pNVar4->u).cons.cdr;
              local_50 = pNVar4;
            } while (p_Var1 != (_Node *)0x0);
          }
          pNVar5 = node_new_list(local_50,(Node *)0x0);
          (pNVar4->u).cons.cdr = pNVar5;
          pNVar4 = pNVar5;
        } while (pNVar5 != (Node *)0x0);
      }
      onig_node_free(node);
      iVar3 = -5;
    }
  }
  return iVar3;
}

Assistant:

static int
prs_branch(Node** top, PToken* tok, int term, UChar** src, UChar* end,
           ParseEnv* env, int group_head)
{
  int r;
  Node *node, **headp;

  *top = NULL;
  INC_PARSE_DEPTH(env->parse_depth);

  r = prs_exp(&node, tok, term, src, end, env, group_head);
  if (r < 0) {
    onig_node_free(node);
    return r;
  }

  if (r == TK_EOT || r == term || r == TK_ALT) {
    *top = node;
  }
  else {
    *top = node_new_list(node, NULL);
    if (IS_NULL(*top)) {
    mem_err:
      onig_node_free(node);
      return ONIGERR_MEMORY;
    }

    headp = &(ND_CDR(*top));
    while (r != TK_EOT && r != term && r != TK_ALT) {
      r = prs_exp(&node, tok, term, src, end, env, FALSE);
      if (r < 0) {
        onig_node_free(node);
        return r;
      }

      if (ND_TYPE(node) == ND_LIST) {
        *headp = node;
        while (IS_NOT_NULL(ND_CDR(node))) node = ND_CDR(node);
        headp = &(ND_CDR(node));
      }
      else {
        *headp = node_new_list(node, NULL);
        if (IS_NULL(*headp)) goto mem_err;
        headp = &(ND_CDR(*headp));
      }
    }
  }

  DEC_PARSE_DEPTH(env->parse_depth);
  return r;
}